

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::AbstractDOMParser
          (AbstractDOMParser *this,XMLValidator *valToAdopt,MemoryManager *manager,
          XMLGrammarPool *gramPool)

{
  XMLBuffer *pXVar1;
  OutOfMemoryException *anon_var_0;
  undefined1 local_50 [8];
  CleanupType_conflict17 cleanup;
  XMLGrammarPool *gramPool_local;
  MemoryManager *manager_local;
  XMLValidator *valToAdopt_local;
  AbstractDOMParser *this_local;
  
  XMemory::XMemory((XMemory *)this);
  XMLDocumentHandler::XMLDocumentHandler(&this->super_XMLDocumentHandler);
  XMLErrorReporter::XMLErrorReporter(&this->super_XMLErrorReporter);
  XMLEntityHandler::XMLEntityHandler(&this->super_XMLEntityHandler);
  DocTypeHandler::DocTypeHandler(&this->super_DocTypeHandler);
  PSVIHandler::PSVIHandler(&this->super_PSVIHandler);
  (this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler =
       (_func_int **)&PTR__AbstractDOMParser_005312a8;
  (this->super_XMLErrorReporter)._vptr_XMLErrorReporter = (_func_int **)&DAT_005313f8;
  (this->super_XMLEntityHandler)._vptr_XMLEntityHandler =
       (_func_int **)&PTR__AbstractDOMParser_00531428;
  (this->super_DocTypeHandler)._vptr_DocTypeHandler = (_func_int **)&PTR__AbstractDOMParser_00531470
  ;
  (this->super_PSVIHandler)._vptr_PSVIHandler = (_func_int **)&PTR__AbstractDOMParser_00531510;
  this->fCreateEntityReferenceNodes = true;
  this->fIncludeIgnorableWhitespace = true;
  this->fWithinElement = false;
  this->fParseInProgress = false;
  this->fCreateCommentNodes = true;
  this->fDocumentAdoptedByUser = false;
  this->fCreateSchemaInfo = false;
  this->fDoXInclude = false;
  this->fScanner = (XMLScanner *)0x0;
  this->fImplementationFeatures = (XMLCh *)0x0;
  this->fCurrentParent = (DOMNode *)0x0;
  this->fCurrentNode = (DOMNode *)0x0;
  this->fCurrentEntity = (DOMEntityImpl *)0x0;
  this->fDocument = (DOMDocumentImpl *)0x0;
  this->fDocumentType = (DOMDocumentTypeImpl *)0x0;
  this->fDocumentVector = (RefVectorOf<xercesc_4_0::DOMDocumentImpl> *)0x0;
  this->fGrammarResolver = (GrammarResolver *)0x0;
  this->fURIStringPool = (XMLStringPool *)0x0;
  this->fValidator = valToAdopt;
  this->fMemoryManager = manager;
  this->fGrammarPool = gramPool;
  XMLBufferMgr::XMLBufferMgr(&this->fBufMgr,manager);
  pXVar1 = XMLBufferMgr::bidOnBuffer(&this->fBufMgr);
  this->fInternalSubset = pXVar1;
  this->fPSVIHandler = (PSVIHandler *)0x0;
  JanitorMemFunCall<xercesc_4_0::AbstractDOMParser>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::AbstractDOMParser> *)local_50,this,(MFPT)cleanUp);
  initialize(this);
  JanitorMemFunCall<xercesc_4_0::AbstractDOMParser>::release
            ((JanitorMemFunCall<xercesc_4_0::AbstractDOMParser> *)local_50);
  JanitorMemFunCall<xercesc_4_0::AbstractDOMParser>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::AbstractDOMParser> *)local_50);
  return;
}

Assistant:

AbstractDOMParser::AbstractDOMParser( XMLValidator* const   valToAdopt
                                    , MemoryManager* const  manager
                                    , XMLGrammarPool* const gramPool) :

  fCreateEntityReferenceNodes(true)
, fIncludeIgnorableWhitespace(true)
, fWithinElement(false)
, fParseInProgress(false)
, fCreateCommentNodes(true)
, fDocumentAdoptedByUser(false)
, fCreateSchemaInfo(false)
, fDoXInclude(false)
, fScanner(0)
, fImplementationFeatures(0)
, fCurrentParent(0)
, fCurrentNode(0)
, fCurrentEntity(0)
, fDocument(0)
, fDocumentType(0)
, fDocumentVector(0)
, fGrammarResolver(0)
, fURIStringPool(0)
, fValidator(valToAdopt)
, fMemoryManager(manager)
, fGrammarPool(gramPool)
, fBufMgr(manager)
, fInternalSubset(fBufMgr.bidOnBuffer())
, fPSVIHandler(0)
{
    CleanupType cleanup(this, &AbstractDOMParser::cleanUp);

    try
    {
        initialize();
    }
    catch(const OutOfMemoryException&)
    {
        // Don't cleanup when out of memory, since executing the
        // code can cause problems.
        cleanup.release();

        throw;
    }

    cleanup.release();
}